

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

string * utilities::normalizePath(string *__return_storage_ptr__,string *path)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  long lVar4;
  _Elt_pointer pbVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  string sep;
  string dir;
  string temp;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  st1;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  st;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  value_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  
  lVar4 = std::__cxx11::string::find((char *)path,0x12650d,0);
  pcVar7 = "/";
  if (lVar4 != -1) {
    pcVar7 = "\\";
  }
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  pcVar6 = "";
  if (lVar4 == -1) {
    pcVar6 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,pcVar7,pcVar6);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_88,0);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_120 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_160._M_dataplus._M_p,
             local_160._M_dataplus._M_p + local_160._M_string_length);
  uVar1 = path->_M_string_length;
  if (uVar1 != 0) {
    uVar9 = 0;
    do {
      local_140._M_string_length = 0;
      *local_140._M_dataplus._M_p = '\0';
      uVar8 = uVar9 - 1;
      do {
        uVar9 = uVar8 + 1;
        lVar4 = uVar8 + 1;
        uVar8 = uVar9;
      } while ((path->_M_dataplus)._M_p[lVar4] == *local_160._M_dataplus._M_p);
      for (; (uVar8 < uVar1 &&
             (uVar9 = uVar8, (path->_M_dataplus)._M_p[uVar8] != *local_160._M_dataplus._M_p));
          uVar8 = uVar8 + 1) {
        std::__cxx11::string::push_back((char)&local_140);
        uVar9 = uVar1;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_140);
      if (iVar3 == 0) {
        if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_88);
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)&local_140);
        if ((iVar3 != 0) && (local_140._M_string_length != 0)) {
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_88,&local_140);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar1);
  }
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&local_f8,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pbVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar5 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_f8,pbVar5 + -1);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_88);
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pbVar5 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pbVar5 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x10;
      }
      pcVar2 = pbVar5[-1]._M_dataplus._M_p;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118,pcVar2,pcVar2 + pbVar5[-1]._M_string_length);
      if (((long)local_f8._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur >> 5) +
          ((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_first >> 5) +
          ((((ulong)((long)local_f8._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
          (ulong)(local_f8._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
          0x10 == 1) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_118._M_dataplus._M_p);
      }
      else {
        std::operator+(&local_a8,&local_118,&local_160);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
    } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string normalizePath(std::string &path)
    {
        std::string sep = (path.find("\\") != std::string::npos) ? "\\" : "/";

        std::stack<std::string> st;
        std::string dir;
        std::string res = sep;

        size_t len_path = path.length();

        for (size_t i = 0; i < len_path; i++)
        {
            dir.clear();
            while (path[i] == sep[0])
                i++;
            while (i < len_path && path[i] != sep[0]) {
                dir.push_back(path[i]);
                i++;
            }

            if (dir.compare("..") == 0)
            {
                if (!st.empty())
                    st.pop();
            }
            else if (dir.compare(".") == 0)
                continue;
            else if (dir.length() != 0)
                st.push(dir);
        }

        std::stack<std::string> st1;
        while (!st.empty())
        {
            st1.push(st.top());
            st.pop();
        }

        while (!st1.empty())
        {
            std::string temp = st1.top();
            
            if (st1.size() != 1)
            {
                res.append(temp + sep);
            }
            else
            {
                res.append(temp);
            }

            st1.pop();
        }

        return res;
    }